

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O3

SparseMatrix<double,_0,_int> * __thiscall
Eigen::SparseMatrix<double,0,int>::operator=
          (SparseMatrix<double,0,int> *this,
          SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_> *other)

{
  int *piVar1;
  Index IVar2;
  Index IVar3;
  void *__ptr;
  Index *pIVar4;
  Index *pIVar5;
  Scalar_conflict *pSVar6;
  Index *pIVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  void *__ptr_00;
  undefined8 *puVar13;
  Index j;
  ulong uVar14;
  Index size;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  size_t sVar21;
  long lVar22;
  undefined1 local_78 [8];
  SparseMatrix<double,_0,_int> dest;
  
  local_78[0] = false;
  stack0xffffffffffffff8c = 0;
  dest.m_innerSize = 0;
  dest._12_4_ = 0;
  dest.m_outerIndex = (Index *)0x0;
  dest.m_innerNonZeros = (Index *)0x0;
  dest.m_data.m_values = (Scalar_conflict *)0x0;
  dest.m_data.m_indices = (Index *)0x0;
  dest.m_data.m_size = 0;
  SparseMatrix<double,_0,_int>::resize
            ((SparseMatrix<double,_0,_int> *)local_78,*(Index *)(other + 4),*(Index *)(other + 8));
  uVar9 = dest._8_8_;
  uVar15 = (ulong)(int)local_78._4_4_;
  if ((long)uVar15 < 0) {
    __assert_fail("vecSize >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                  ,0x8a,
                  "Eigen::MapBase<Eigen::Map<Eigen::Matrix<int, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<int, -1, 1>>, Level = 0]"
                 );
  }
  uVar14 = uVar15;
  if (((dest._8_8_ & 3) == 0) &&
     (uVar14 = (ulong)(-((uint)((ulong)dest._8_8_ >> 2) & 0x3fffffff) & 3), uVar15 <= uVar14)) {
    uVar14 = uVar15;
  }
  lVar19 = uVar15 - uVar14;
  iVar11 = (int)lVar19;
  iVar10 = iVar11 + 3;
  if (-1 < iVar11) {
    iVar10 = iVar11;
  }
  sVar21 = (size_t)(iVar10 >> 2);
  if (uVar14 != 0) {
    memset((void *)dest._8_8_,0,uVar14 * 4);
  }
  lVar22 = sVar21 * 4 + uVar14;
  dest.m_data.m_allocatedSize = sVar21;
  if (3 < lVar19) {
    lVar12 = uVar14 + 4;
    if ((long)(uVar14 + 4) < lVar22) {
      lVar12 = lVar22;
    }
    memset((void *)(uVar9 + uVar14 * 4),0,(~uVar14 + lVar12 & 0xfffffffffffffffc) * 4 + 0x10);
  }
  if (lVar22 < (long)uVar15) {
    memset((void *)(uVar9 + dest.m_data.m_allocatedSize * 0x10 + uVar14 * 4),0,
           (lVar19 + dest.m_data.m_allocatedSize * -4) * 4);
  }
  iVar11 = *(int *)(other + 4);
  if (0 < iVar11) {
    lVar19 = *(long *)(other + 0x28);
    lVar22 = *(long *)(other + 0x10);
    lVar12 = *(long *)(other + 0x18);
    lVar16 = 0;
    do {
      iVar10 = *(int *)(lVar22 + lVar16 * 4);
      lVar17 = (long)iVar10;
      if (lVar12 == 0) {
        iVar18 = *(int *)(lVar22 + 4 + lVar16 * 4);
      }
      else {
        iVar18 = *(int *)(lVar12 + lVar16 * 4) + iVar10;
      }
      if (iVar10 < iVar18) {
        do {
          piVar1 = (int *)(dest._8_8_ + (long)*(int *)(lVar19 + lVar17 * 4) * 4);
          *piVar1 = *piVar1 + 1;
          lVar17 = lVar17 + 1;
        } while (iVar18 != lVar17);
        iVar11 = *(int *)(other + 4);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar11);
  }
  uVar8 = local_78._4_4_;
  uVar15 = stack0xffffffffffffff8c & 0xffffffff;
  if (uVar15 == 0) {
    __ptr_00 = (void *)0x0;
    lVar19 = 0;
    iVar11 = 0;
  }
  else {
    if (((int)local_78._4_4_ < 0) || (__ptr_00 = malloc(uVar15 * 4), __ptr_00 == (void *)0x0)) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = std::streambuf::xsgetn;
      __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    uVar14 = 0;
    iVar11 = 0;
    do {
      iVar10 = *(int *)(dest._8_8_ + uVar14 * 4);
      *(int *)(dest._8_8_ + uVar14 * 4) = iVar11;
      if (uVar15 == uVar14) {
LAB_001488d9:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x17a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
                     );
      }
      *(int *)((long)__ptr_00 + uVar14 * 4) = iVar11;
      iVar11 = iVar11 + iVar10;
      uVar14 = uVar14 + 1;
      lVar19 = (long)(int)local_78._4_4_;
    } while ((long)uVar14 < lVar19);
  }
  *(int *)(dest._8_8_ + lVar19 * 4) = iVar11;
  internal::CompressedStorage<double,_int>::resize
            ((CompressedStorage<double,_int> *)&dest.m_innerNonZeros,(long)iVar11,0.0);
  iVar11 = *(int *)(other + 4);
  if (0 < iVar11) {
    dest.m_data.m_allocatedSize = *(size_t *)(other + 0x20);
    lVar19 = *(long *)(other + 0x28);
    lVar22 = *(long *)(other + 0x10);
    lVar12 = *(long *)(other + 0x18);
    lVar16 = 0;
    do {
      iVar10 = *(int *)(lVar22 + lVar16 * 4);
      if (lVar12 == 0) {
        iVar18 = *(int *)(lVar22 + 4 + lVar16 * 4);
      }
      else {
        iVar18 = *(int *)(lVar12 + lVar16 * 4) + iVar10;
      }
      if (iVar10 < iVar18) {
        lVar17 = 0;
        do {
          iVar11 = *(int *)(lVar19 + (long)iVar10 * 4 + lVar17 * 4);
          lVar20 = (long)iVar11;
          if ((lVar20 < 0) || ((int)uVar8 <= iVar11)) goto LAB_001488d9;
          iVar11 = *(int *)((long)__ptr_00 + lVar20 * 4);
          *(int *)((long)__ptr_00 + lVar20 * 4) = iVar11 + 1;
          *(int *)((long)dest.m_data.m_values + (long)iVar11 * 4) = (int)lVar16;
          *(undefined8 *)(dest.m_innerNonZeros + (long)iVar11 * 2) =
               *(undefined8 *)(dest.m_data.m_allocatedSize + (long)iVar10 * 8 + lVar17 * 8);
          lVar17 = lVar17 + 1;
        } while (iVar18 - iVar10 != (int)lVar17);
        iVar11 = *(int *)(other + 4);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar11);
  }
  __ptr = *(void **)(this + 0x10);
  *(undefined8 *)(this + 0x10) = dest._8_8_;
  IVar2 = *(Index *)(this + 8);
  *(undefined4 *)(this + 8) = dest._0_4_;
  IVar3 = *(Index *)(this + 4);
  *(undefined4 *)(this + 4) = local_78._4_4_;
  dest._0_4_ = IVar2;
  local_78._4_4_ = IVar3;
  pIVar4 = *(Index **)(this + 0x18);
  *(Index **)(this + 0x18) = dest.m_outerIndex;
  pIVar5 = *(Index **)(this + 0x20);
  *(Index **)(this + 0x20) = dest.m_innerNonZeros;
  pSVar6 = *(Scalar_conflict **)(this + 0x28);
  *(Scalar_conflict **)(this + 0x28) = dest.m_data.m_values;
  pIVar7 = *(Index **)(this + 0x30);
  *(Index **)(this + 0x30) = dest.m_data.m_indices;
  sVar21 = *(size_t *)(this + 0x38);
  *(size_t *)(this + 0x38) = dest.m_data.m_size;
  dest._8_8_ = __ptr;
  dest.m_outerIndex = pIVar4;
  dest.m_innerNonZeros = pIVar5;
  dest.m_data.m_values = pSVar6;
  dest.m_data.m_indices = pIVar7;
  dest.m_data.m_size = sVar21;
  free(__ptr_00);
  free(__ptr);
  free(dest.m_outerIndex);
  internal::CompressedStorage<double,_int>::~CompressedStorage
            ((CompressedStorage<double,_int> *)&dest.m_innerNonZeros);
  return (SparseMatrix<double,_0,_int> *)this;
}

Assistant:

EIGEN_DONT_INLINE SparseMatrix<Scalar,_Options,_Index>& SparseMatrix<Scalar,_Options,_Index>::operator=(const SparseMatrixBase<OtherDerived>& other)
{
  EIGEN_STATIC_ASSERT((internal::is_same<Scalar, typename OtherDerived::Scalar>::value),
        YOU_MIXED_DIFFERENT_NUMERIC_TYPES__YOU_NEED_TO_USE_THE_CAST_METHOD_OF_MATRIXBASE_TO_CAST_NUMERIC_TYPES_EXPLICITLY)
  
  const bool needToTranspose = (Flags & RowMajorBit) != (OtherDerived::Flags & RowMajorBit);
  if (needToTranspose)
  {
    // two passes algorithm:
    //  1 - compute the number of coeffs per dest inner vector
    //  2 - do the actual copy/eval
    // Since each coeff of the rhs has to be evaluated twice, let's evaluate it if needed
    typedef typename internal::nested<OtherDerived,2>::type OtherCopy;
    typedef typename internal::remove_all<OtherCopy>::type _OtherCopy;
    OtherCopy otherCopy(other.derived());

    SparseMatrix dest(other.rows(),other.cols());
    Eigen::Map<Matrix<Index, Dynamic, 1> > (dest.m_outerIndex,dest.outerSize()).setZero();

    // pass 1
    // FIXME the above copy could be merged with that pass
    for (Index j=0; j<otherCopy.outerSize(); ++j)
      for (typename _OtherCopy::InnerIterator it(otherCopy, j); it; ++it)
        ++dest.m_outerIndex[it.index()];

    // prefix sum
    Index count = 0;
    Matrix<Index,Dynamic,1> positions(dest.outerSize());
    for (Index j=0; j<dest.outerSize(); ++j)
    {
      Index tmp = dest.m_outerIndex[j];
      dest.m_outerIndex[j] = count;
      positions[j] = count;
      count += tmp;
    }
    dest.m_outerIndex[dest.outerSize()] = count;
    // alloc
    dest.m_data.resize(count);
    // pass 2
    for (Index j=0; j<otherCopy.outerSize(); ++j)
    {
      for (typename _OtherCopy::InnerIterator it(otherCopy, j); it; ++it)
      {
        Index pos = positions[it.index()]++;
        dest.m_data.index(pos) = j;
        dest.m_data.value(pos) = it.value();
      }
    }
    this->swap(dest);
    return *this;
  }
  else
  {
    if(other.isRValue())
      initAssignment(other.derived());
    // there is no special optimization
    return Base::operator=(other.derived());
  }
}